

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

htmlDocPtr htmlReadMemory(char *buffer,int size,char *URL,char *encoding,int options)

{
  _xmlSAXHandler *__dest;
  xmlParserCtxtPtr ctxt;
  xmlSAXHandlerV1 *__src;
  htmlDocPtr pxVar1;
  
  xmlInitParser();
  ctxt = xmlCreateMemoryParserCtxt(buffer,size);
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    htmlDefaultSAXHandlerInit();
    __dest = ctxt->sax;
    if (__dest != (_xmlSAXHandler *)0x0) {
      __src = __htmlDefaultSAXHandler();
      memcpy(__dest,__src,0xe0);
    }
    pxVar1 = htmlDoRead(ctxt,URL,encoding,options,0);
    return pxVar1;
  }
  return (htmlDocPtr)0x0;
}

Assistant:

htmlDocPtr
htmlReadMemory(const char *buffer, int size, const char *URL, const char *encoding, int options)
{
    htmlParserCtxtPtr ctxt;

    xmlInitParser();
    ctxt = xmlCreateMemoryParserCtxt(buffer, size);
    if (ctxt == NULL)
        return (NULL);
    htmlDefaultSAXHandlerInit();
    if (ctxt->sax != NULL)
        memcpy(ctxt->sax, &htmlDefaultSAXHandler, sizeof(xmlSAXHandlerV1));
    return (htmlDoRead(ctxt, URL, encoding, options, 0));
}